

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader.h
# Opt level: O1

int aom_read_symbol_(aom_reader *r,aom_cdf_prob *cdf,int nsymbs)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar4 = od_ec_decode_cdf_q15(&r->ec,cdf,nsymbs);
  if (r->allow_update_cdf != '\0') {
    uVar1 = cdf[nsymbs];
    bVar5 = (char)(uVar1 >> 4) + (3 < nsymbs) + 4;
    uVar6 = 1;
    if (1 < (int)(nsymbs - 1U)) {
      uVar6 = (ulong)(nsymbs - 1U);
    }
    uVar7 = 0;
    do {
      uVar2 = cdf[uVar7];
      if ((long)uVar7 < (long)(char)iVar4) {
        sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar5 & 0x1f));
      }
      else {
        sVar3 = -(uVar2 >> (bVar5 & 0x1f));
      }
      cdf[uVar7] = sVar3 + uVar2;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
    cdf[nsymbs] = cdf[nsymbs] + (ushort)(uVar1 < 0x20);
  }
  return iVar4;
}

Assistant:

static inline int aom_read_symbol_(aom_reader *r, aom_cdf_prob *cdf,
                                   int nsymbs ACCT_STR_PARAM) {
  int ret;
  ret = aom_read_cdf(r, cdf, nsymbs, ACCT_STR_NAME);
  if (r->allow_update_cdf) update_cdf(cdf, ret, nsymbs);
  return ret;
}